

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_DUBT_findBestMatch
                 (ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,size_t *offsetPtr,U32 mls,
                 ZSTD_dictMode_e dictMode)

{
  BYTE *pBVar1;
  U32 UVar2;
  BYTE *pBVar3;
  ZSTD_matchState_t *pZVar4;
  BYTE *pBVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  ulong *puVar14;
  ulong uVar15;
  ulong uVar16;
  ulong *puVar17;
  ulong uVar18;
  char cVar19;
  int iVar20;
  uint *puVar21;
  long lVar22;
  ulong *puVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint *puVar27;
  uint uVar28;
  BYTE *pBVar29;
  BYTE *pInLoopLimit_1;
  BYTE *pBVar30;
  uint uVar31;
  ulong *puVar32;
  ulong uVar33;
  uint uVar34;
  int iVar35;
  uint uVar36;
  uint uVar37;
  U32 UVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  U32 *pUVar42;
  ulong *puVar43;
  uint uVar44;
  uint uVar45;
  bool bVar46;
  BYTE *pInLoopLimit;
  U32 dummy32;
  ulong local_118;
  BYTE *local_100;
  uint *local_f8;
  uint *local_f0;
  uint local_68;
  uint local_64;
  U32 *local_60;
  ulong local_58;
  U32 *local_50;
  BYTE *local_48;
  BYTE *local_40;
  ulong *local_38;
  
  local_58 = (ulong)(mls - 5);
  cVar19 = (char)(ms->cParams).hashLog;
  switch(local_58) {
  case 0:
    lVar22 = -0x30e4432345000000;
    break;
  case 1:
    lVar22 = -0x30e4432340650000;
    break;
  case 2:
    lVar22 = -0x30e44323405a9d00;
    break;
  case 3:
    uVar9 = *(long *)ip * -0x30e44323485a9b9d;
    goto LAB_00174696;
  default:
    uVar9 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-cVar19 & 0x1fU));
    goto LAB_0017469b;
  }
  uVar9 = lVar22 * *(long *)ip;
LAB_00174696:
  uVar9 = uVar9 >> (-cVar19 & 0x3fU);
LAB_0017469b:
  pBVar3 = (ms->window).base;
  uVar36 = (int)ip - (int)pBVar3;
  UVar2 = (ms->window).lowLimit;
  uVar24 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  UVar38 = uVar36 - uVar24;
  if (uVar36 - UVar2 <= uVar24) {
    UVar38 = UVar2;
  }
  if (ms->loadedDictEnd != 0) {
    UVar38 = UVar2;
  }
  uVar39 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  uVar24 = uVar36 - uVar39;
  if (uVar36 < uVar39) {
    uVar24 = 0;
  }
  uVar28 = UVar38;
  if (UVar38 < uVar24) {
    uVar28 = uVar24;
  }
  uVar25 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
  if (iend + -8 < ip) {
    __assert_fail("ip <= iend-8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3fdb,
                  "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_50 = ms->hashTable;
  pUVar42 = ms->chainTable;
  uVar41 = local_50[uVar9];
  local_60 = pUVar42;
  if (uVar28 < uVar41) {
    uVar33 = 0;
    uVar44 = uVar25;
    do {
      uVar10 = (ulong)uVar41;
      uVar18 = (ulong)((uVar41 & uVar39) * 2);
      if ((pUVar42[uVar18 + 1] != 1) || (uVar44 < 2)) {
        if (pUVar42[uVar18 + 1] == 1) {
          (pUVar42 + uVar18)[0] = 0;
          (pUVar42 + uVar18)[1] = 0;
        }
        uVar10 = uVar33;
        if ((U32)uVar33 == 0) goto LAB_00174b78;
        break;
      }
      pUVar42[uVar18 + 1] = (U32)uVar33;
      uVar44 = uVar44 - 1;
      uVar41 = pUVar42[uVar18];
      uVar33 = uVar10;
    } while (uVar28 < uVar41);
    local_100 = (ms->window).dictBase;
    do {
      uVar41 = (ms->window).dictLimit;
      uVar33 = (ulong)uVar41;
      local_38 = (ulong *)(local_100 + uVar33);
      uVar37 = (uint)uVar10;
      puVar43 = (ulong *)iend;
      pBVar29 = pBVar3;
      if (uVar37 < uVar41) {
        puVar43 = local_38;
        pBVar29 = local_100;
      }
      uVar26 = (ms->window).lowLimit;
      uVar34 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      uVar31 = uVar37 - uVar34;
      if (uVar37 - uVar26 <= uVar34) {
        uVar31 = uVar26;
      }
      if (uVar37 < uVar28) {
        __assert_fail("current >= btLow",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3f34,
                      "void ZSTD_insertDUBT1(ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                     );
      }
      puVar23 = (ulong *)(pBVar29 + uVar10);
      if (puVar43 <= puVar23) {
        __assert_fail("ip < iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3f35,
                      "void ZSTD_insertDUBT1(ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                     );
      }
      uVar26 = pUVar42[(ulong)((uVar37 & uVar39) * 2) + 1];
      uVar40 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
      uVar34 = (uVar37 & uVar40) * 2;
      local_f8 = pUVar42 + uVar34;
      puVar21 = local_f8 + 1;
      if ((uVar44 != 0) && (uVar34 = pUVar42[uVar34], uVar31 < uVar34)) {
        local_40 = pBVar3 + uVar33;
        local_48 = pBVar29 + uVar10 + 8;
        uVar18 = 0;
        uVar10 = 0;
        uVar45 = uVar44;
        do {
          uVar12 = uVar10;
          if (uVar18 < uVar10) {
            uVar12 = uVar18;
          }
          if (uVar37 <= uVar34) {
            __assert_fail("matchIndex < current",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x3f3a,
                          "void ZSTD_insertDUBT1(ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                         );
          }
          uVar16 = (ulong)uVar34;
          uVar13 = uVar16 + uVar12;
          pBVar29 = pBVar3;
          if (dictMode == ZSTD_extDict) {
            if ((uVar37 < uVar41) || (uVar33 <= uVar13)) {
              if (uVar13 < uVar33) {
                pBVar29 = local_100;
              }
              goto LAB_001749a9;
            }
            sVar11 = ZSTD_count_2segments
                               ((byte *)((long)puVar23 + uVar12),local_100 + uVar16 + uVar12,
                                (BYTE *)puVar43,(BYTE *)local_38,local_40);
            uVar12 = sVar11 + uVar12;
            pBVar29 = pBVar3 + uVar16;
            pUVar42 = local_60;
            if (uVar12 + uVar16 < uVar33) {
              pBVar29 = local_100 + uVar16;
            }
          }
          else {
LAB_001749a9:
            if ((uVar41 <= uVar37) && (uVar13 < uVar33)) {
              __assert_fail("(matchIndex+matchLength >= dictLimit) || (current < dictLimit)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x3f46,
                            "void ZSTD_insertDUBT1(ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                           );
            }
            puVar17 = (ulong *)((long)puVar23 + uVar12);
            puVar32 = (ulong *)(pBVar29 + uVar16 + uVar12);
            puVar14 = puVar17;
            if (puVar17 < (ulong *)((long)puVar43 - 7U)) {
              if (*puVar32 == *puVar17) {
                lVar22 = 0;
                do {
                  puVar14 = (ulong *)(local_48 + lVar22 + uVar12);
                  if ((ulong *)((long)puVar43 - 7U) <= puVar14) {
                    puVar32 = (ulong *)(pBVar29 + lVar22 + uVar13 + 8);
                    goto LAB_00174a5e;
                  }
                  lVar8 = lVar22 + uVar13 + 8;
                  lVar22 = lVar22 + 8;
                } while (*(ulong *)(pBVar29 + lVar8) == *puVar14);
                uVar15 = *puVar14 ^ *(ulong *)(pBVar29 + lVar8);
                uVar13 = 0;
                if (uVar15 != 0) {
                  for (; (uVar15 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                  }
                }
                uVar13 = (uVar13 >> 3 & 0x1fffffff) + lVar22;
              }
              else {
                uVar15 = *puVar17 ^ *puVar32;
                uVar13 = 0;
                if (uVar15 != 0) {
                  for (; (uVar15 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                  }
                }
                uVar13 = uVar13 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_00174a5e:
              if ((puVar14 < (ulong *)((long)puVar43 - 3U)) && ((int)*puVar32 == (int)*puVar14)) {
                puVar14 = (ulong *)((long)puVar14 + 4);
                puVar32 = (ulong *)((long)puVar32 + 4);
              }
              if ((puVar14 < (ulong *)((long)puVar43 - 1U)) && ((short)*puVar32 == (short)*puVar14))
              {
                puVar14 = (ulong *)((long)puVar14 + 2);
                puVar32 = (ulong *)((long)puVar32 + 2);
              }
              if (puVar14 < puVar43) {
                puVar14 = (ulong *)((long)puVar14 + (ulong)((byte)*puVar32 == (byte)*puVar14));
              }
              uVar13 = (long)puVar14 - (long)puVar17;
            }
            uVar12 = uVar13 + uVar12;
            pBVar29 = pBVar29 + uVar16;
          }
          if ((ulong *)((long)puVar23 + uVar12) == puVar43) break;
          puVar27 = pUVar42 + (uVar34 & uVar40) * 2;
          if (pBVar29[uVar12] < (byte)*(ulong *)((long)puVar23 + uVar12)) {
            *local_f8 = uVar34;
            if (uVar34 <= uVar28) {
              local_f8 = &local_64;
              break;
            }
            puVar27 = puVar27 + 1;
            uVar18 = uVar12;
            local_f8 = puVar27;
          }
          else {
            *puVar21 = uVar34;
            uVar10 = uVar12;
            puVar21 = puVar27;
            if (uVar34 <= uVar28) {
              puVar21 = &local_64;
              break;
            }
          }
          uVar45 = uVar45 - 1;
          if ((uVar45 == 0) || (uVar34 = *puVar27, uVar34 <= uVar31)) break;
        } while( true );
      }
      *puVar21 = 0;
      *local_f8 = 0;
      uVar44 = uVar44 + 1;
      uVar10 = (ulong)uVar26;
    } while (uVar26 != 0);
  }
  else {
LAB_00174b78:
    local_100 = (ms->window).dictBase;
  }
  uVar10 = (ulong)(ms->window).dictLimit;
  uVar33 = (ulong)((uVar39 & uVar36) * 2);
  local_f0 = pUVar42 + uVar33;
  puVar21 = pUVar42 + uVar33 + 1;
  uVar41 = uVar36 + 9;
  uVar28 = local_50[uVar9];
  local_50[uVar9] = uVar36;
  iVar35 = uVar25 - 1;
  if (UVar38 < uVar28) {
    uVar9 = 0;
    uVar33 = 0;
    uVar18 = 0;
    do {
      uVar13 = (ulong)uVar28;
      uVar12 = uVar33;
      if (uVar18 < uVar33) {
        uVar12 = uVar18;
      }
      uVar16 = uVar12 + uVar13;
      puVar43 = (ulong *)(ip + uVar12);
      if ((dictMode == ZSTD_extDict) && (uVar16 < uVar10)) {
        sVar11 = ZSTD_count_2segments
                           ((BYTE *)puVar43,local_100 + uVar13 + uVar12,iend,local_100 + uVar10,
                            pBVar3 + uVar10);
        uVar12 = sVar11 + uVar12;
        pBVar29 = pBVar3 + uVar13;
        if (uVar12 + uVar13 < uVar10) {
          pBVar29 = local_100 + uVar13;
        }
      }
      else {
        puVar23 = (ulong *)(pBVar3 + uVar13 + uVar12);
        puVar17 = puVar43;
        if (puVar43 < iend + -7) {
          if (*puVar23 == *puVar43) {
            lVar22 = 0;
            do {
              puVar17 = (ulong *)(ip + lVar22 + uVar12 + 8);
              if (iend + -7 <= puVar17) {
                puVar23 = (ulong *)(pBVar3 + uVar16 + lVar22 + 8);
                goto LAB_00174d69;
              }
              lVar8 = lVar22 + uVar16 + 8;
              lVar22 = lVar22 + 8;
            } while (*(ulong *)(pBVar3 + lVar8) == *puVar17);
            uVar15 = *puVar17 ^ *(ulong *)(pBVar3 + lVar8);
            uVar16 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
              }
            }
            uVar16 = (uVar16 >> 3 & 0x1fffffff) + lVar22;
          }
          else {
            uVar15 = *puVar43 ^ *puVar23;
            uVar16 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
              }
            }
            uVar16 = uVar16 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_00174d69:
          if ((puVar17 < iend + -3) && ((int)*puVar23 == (int)*puVar17)) {
            puVar17 = (ulong *)((long)puVar17 + 4);
            puVar23 = (ulong *)((long)puVar23 + 4);
          }
          if ((puVar17 < iend + -1) && ((short)*puVar23 == (short)*puVar17)) {
            puVar17 = (ulong *)((long)puVar17 + 2);
            puVar23 = (ulong *)((long)puVar23 + 2);
          }
          if (puVar17 < iend) {
            puVar17 = (ulong *)((long)puVar17 + (ulong)((BYTE)*puVar23 == (BYTE)*puVar17));
          }
          uVar16 = (long)puVar17 - (long)puVar43;
        }
        uVar12 = uVar16 + uVar12;
        pBVar29 = pBVar3 + uVar13;
      }
      if (uVar9 < uVar12) {
        if (uVar41 - uVar28 < uVar12) {
          uVar41 = uVar28 + (int)uVar12;
        }
        uVar25 = (uVar36 - uVar28) + 1;
        if ((uVar25 == 0) || (uVar44 = (int)*offsetPtr + 1, uVar44 == 0)) goto LAB_00175233;
        iVar20 = 0x1f;
        if (uVar25 != 0) {
          for (; uVar25 >> iVar20 == 0; iVar20 = iVar20 + -1) {
          }
        }
        iVar6 = 0x1f;
        if (uVar44 != 0) {
          for (; uVar44 >> iVar6 == 0; iVar6 = iVar6 + -1) {
          }
        }
        if (iVar20 - iVar6 < ((int)uVar12 - (int)uVar9) * 4) {
          *offsetPtr = (ulong)((uVar36 + 2) - uVar28);
          uVar9 = uVar12;
        }
        if (ip + uVar12 == iend) {
          if (dictMode == ZSTD_dictMatchState) {
            iVar35 = 0;
          }
          goto LAB_00174ee2;
        }
      }
      puVar27 = local_60 + (uVar28 & uVar39) * 2;
      if (pBVar29[uVar12] < ip[uVar12]) {
        *local_f0 = uVar28;
        if (uVar28 <= uVar24) {
          local_f0 = &local_68;
          goto LAB_00174ee2;
        }
        puVar27 = puVar27 + 1;
        uVar18 = uVar12;
        local_f0 = puVar27;
      }
      else {
        *puVar21 = uVar28;
        uVar33 = uVar12;
        puVar21 = puVar27;
        if (uVar28 <= uVar24) {
          puVar21 = &local_68;
          goto LAB_00174ee2;
        }
      }
      bVar46 = iVar35 == 0;
      iVar35 = iVar35 + -1;
      if ((bVar46) || (uVar28 = *puVar27, uVar28 <= UVar38)) goto LAB_00174ee2;
    } while( true );
  }
  uVar9 = 0;
LAB_00174ee2:
  *puVar21 = 0;
  *local_f0 = 0;
  if ((dictMode == ZSTD_dictMatchState) && (iVar35 != 0)) {
    pZVar4 = ms->dictMatchState;
    if ((uint)local_58 < 4) {
      sVar11 = (*(code *)(&DAT_001b3e18 + *(int *)(&DAT_001b3e18 + local_58 * 4)))
                         (&DAT_001b3e18 + *(int *)(&DAT_001b3e18 + local_58 * 4));
      return sVar11;
    }
    pBVar29 = (pZVar4->window).nextSrc;
    pBVar5 = (pZVar4->window).base;
    uVar33 = (long)pBVar29 - (long)pBVar5;
    uVar24 = (pZVar4->window).lowLimit;
    uVar28 = ~(-1 << ((char)(pZVar4->cParams).chainLog - 1U & 0x1f));
    iVar20 = (int)uVar33;
    uVar39 = iVar20 - uVar28;
    if (iVar20 - uVar24 <= uVar28) {
      uVar39 = uVar24;
    }
    uVar25 = pZVar4->hashTable
             [(uint)(*(int *)ip * -0x61c8864f) >> (-(char)(pZVar4->cParams).hashLog & 0x1fU)];
    if (uVar24 < uVar25) {
      uVar44 = (ms->window).dictLimit;
      uVar37 = (ms->window).lowLimit - iVar20;
      pUVar42 = pZVar4->chainTable;
      uVar10 = 0;
      local_118 = 0;
      do {
        iVar35 = iVar35 + -1;
        uVar18 = uVar10;
        if (local_118 < uVar10) {
          uVar18 = local_118;
        }
        uVar12 = (ulong)uVar25;
        pBVar1 = pBVar5 + uVar12;
        sVar11 = ZSTD_count_2segments(ip + uVar18,pBVar1 + uVar18,iend,pBVar29,pBVar3 + uVar44);
        uVar18 = sVar11 + uVar18;
        pBVar30 = pBVar3 + uVar12 + uVar37;
        if (uVar18 + uVar12 < (uVar33 & 0xffffffff)) {
          pBVar30 = pBVar1;
        }
        if (uVar9 < uVar18) {
          iVar20 = uVar37 + uVar25;
          uVar26 = (uVar36 - iVar20) + 1;
          if ((uVar26 == 0) || (uVar31 = (int)*offsetPtr + 1, uVar31 == 0)) {
LAB_00175233:
            __assert_fail("val != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x12c2,"U32 ZSTD_highbit32(U32)");
          }
          iVar6 = 0x1f;
          if (uVar26 != 0) {
            for (; uVar26 >> iVar6 == 0; iVar6 = iVar6 + -1) {
            }
          }
          iVar7 = 0x1f;
          if (uVar31 != 0) {
            for (; uVar31 >> iVar7 == 0; iVar7 = iVar7 + -1) {
            }
          }
          if (iVar6 - iVar7 < ((int)uVar18 - (int)uVar9) * 4) {
            *offsetPtr = (ulong)((uVar36 + 2) - iVar20);
            uVar9 = uVar18;
          }
          if (ip + uVar18 == iend) break;
        }
        puVar21 = pUVar42 + (uVar25 & uVar28) * 2;
        if (pBVar30[uVar18] < ip[uVar18]) {
          if (uVar25 <= uVar39) break;
          puVar21 = puVar21 + 1;
          local_118 = uVar18;
        }
        else {
          uVar10 = uVar18;
          if (uVar25 <= uVar39) break;
        }
        if ((iVar35 == 0) || (uVar25 = *puVar21, uVar25 <= uVar24)) break;
      } while( true );
    }
  }
  if (uVar36 + 8 < uVar41) {
    ms->nextToUpdate = uVar41 - 8;
    return uVar9;
  }
  __assert_fail("matchEndIdx > current+8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x4045,
                "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
               );
}

Assistant:

static size_t
ZSTD_DUBT_findBestMatch(ZSTD_matchState_t* ms,
                        const BYTE* const ip, const BYTE* const iend,
                        size_t* offsetPtr,
                        U32 const mls,
                        const ZSTD_dictMode_e dictMode)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32          matchIndex  = hashTable[h];

    const BYTE* const base = ms->window.base;
    U32    const current = (U32)(ip-base);
    U32    const windowLow = ZSTD_getLowestMatchIndex(ms, current, cParams->windowLog);

    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32    const btLow = (btMask >= current) ? 0 : current - btMask;
    U32    const unsortLimit = MAX(btLow, windowLow);

    U32*         nextCandidate = bt + 2*(matchIndex&btMask);
    U32*         unsortedMark = bt + 2*(matchIndex&btMask) + 1;
    U32          nbCompares = 1U << cParams->searchLog;
    U32          nbCandidates = nbCompares;
    U32          previousCandidate = 0;

    DEBUGLOG(7, "ZSTD_DUBT_findBestMatch (%u) ", current);
    assert(ip <= iend-8);   /* required for h calculation */

    /* reach end of unsorted candidates list */
    while ( (matchIndex > unsortLimit)
         && (*unsortedMark == ZSTD_DUBT_UNSORTED_MARK)
         && (nbCandidates > 1) ) {
        DEBUGLOG(8, "ZSTD_DUBT_findBestMatch: candidate %u is unsorted",
                    matchIndex);
        *unsortedMark = previousCandidate;  /* the unsortedMark becomes a reversed chain, to move up back to original position */
        previousCandidate = matchIndex;
        matchIndex = *nextCandidate;
        nextCandidate = bt + 2*(matchIndex&btMask);
        unsortedMark = bt + 2*(matchIndex&btMask) + 1;
        nbCandidates --;
    }

    /* nullify last candidate if it's still unsorted
     * simplification, detrimental to compression ratio, beneficial for speed */
    if ( (matchIndex > unsortLimit)
      && (*unsortedMark==ZSTD_DUBT_UNSORTED_MARK) ) {
        DEBUGLOG(7, "ZSTD_DUBT_findBestMatch: nullify last unsorted candidate %u",
                    matchIndex);
        *nextCandidate = *unsortedMark = 0;
    }

    /* batch sort stacked candidates */
    matchIndex = previousCandidate;
    while (matchIndex) {  /* will end on matchIndex == 0 */
        U32* const nextCandidateIdxPtr = bt + 2*(matchIndex&btMask) + 1;
        U32 const nextCandidateIdx = *nextCandidateIdxPtr;
        ZSTD_insertDUBT1(ms, matchIndex, iend,
                         nbCandidates, unsortLimit, dictMode);
        matchIndex = nextCandidateIdx;
        nbCandidates++;
    }

    /* find longest match */
    {   size_t commonLengthSmaller = 0, commonLengthLarger = 0;
        const BYTE* const dictBase = ms->window.dictBase;
        const U32 dictLimit = ms->window.dictLimit;
        const BYTE* const dictEnd = dictBase + dictLimit;
        const BYTE* const prefixStart = base + dictLimit;
        U32* smallerPtr = bt + 2*(current&btMask);
        U32* largerPtr  = bt + 2*(current&btMask) + 1;
        U32 matchEndIdx = current + 8 + 1;
        U32 dummy32;   /* to be nullified at the end */
        size_t bestLength = 0;

        matchIndex  = hashTable[h];
        hashTable[h] = current;   /* Update Hash Table */

        while (nbCompares-- && (matchIndex > windowLow)) {
            U32* const nextPtr = bt + 2*(matchIndex & btMask);
            size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
            const BYTE* match;

            if ((dictMode != ZSTD_extDict) || (matchIndex+matchLength >= dictLimit)) {
                match = base + matchIndex;
                matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
            } else {
                match = dictBase + matchIndex;
                matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
                if (matchIndex+matchLength >= dictLimit)
                    match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
            }

            if (matchLength > bestLength) {
                if (matchLength > matchEndIdx - matchIndex)
                    matchEndIdx = matchIndex + (U32)matchLength;
                if ( (4*(int)(matchLength-bestLength)) > (int)(ZSTD_highbit32(current-matchIndex+1) - ZSTD_highbit32((U32)offsetPtr[0]+1)) )
                    bestLength = matchLength, *offsetPtr = ZSTD_REP_MOVE + current - matchIndex;
                if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
                    if (dictMode == ZSTD_dictMatchState) {
                        nbCompares = 0; /* in addition to avoiding checking any
                                         * further in this loop, make sure we
                                         * skip checking in the dictionary. */
                    }
                    break;   /* drop, to guarantee consistency (miss a little bit of compression) */
                }
            }

            if (match[matchLength] < ip[matchLength]) {
                /* match is smaller than current */
                *smallerPtr = matchIndex;             /* update smaller idx */
                commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
                if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
                matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            } else {
                /* match is larger than current */
                *largerPtr = matchIndex;
                commonLengthLarger = matchLength;
                if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                largerPtr = nextPtr;
                matchIndex = nextPtr[0];
        }   }

        *smallerPtr = *largerPtr = 0;

        if (dictMode == ZSTD_dictMatchState && nbCompares) {
            bestLength = ZSTD_DUBT_findBetterDictMatch(
                    ms, ip, iend,
                    offsetPtr, bestLength, nbCompares,
                    mls, dictMode);
        }

        assert(matchEndIdx > current+8); /* ensure nextToUpdate is increased */
        ms->nextToUpdate = matchEndIdx - 8;   /* skip repetitive patterns */
        if (bestLength >= MINMATCH) {
            U32 const mIndex = current - ((U32)*offsetPtr - ZSTD_REP_MOVE); (void)mIndex;
            DEBUGLOG(8, "ZSTD_DUBT_findBestMatch(%u) : found match of length %u and offsetCode %u (pos %u)",
                        current, (U32)bestLength, (U32)*offsetPtr, mIndex);
        }
        return bestLength;
    }
}